

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

int __thiscall
zmq::router_t::get_peer_state(router_t *this,void *routing_id_,size_t routing_id_size_)

{
  out_pipe_t *poVar1;
  int *piVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  out_pipe_t *out_pipe;
  blob_t routing_id_blob;
  int res;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  blob_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  blob_t local_40;
  uint local_24;
  uint local_4;
  
  local_24 = 0;
  blob_t::blob_t(&local_40,in_RSI,in_RDX);
  poVar1 = routing_socket_base_t::lookup_out_pipe
                     ((routing_socket_base_t *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  if (poVar1 == (out_pipe_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x71;
    local_4 = 0xffffffff;
  }
  else {
    in_stack_ffffffffffffff87 = pipe_t::check_hwm(poVar1->pipe);
    if ((bool)in_stack_ffffffffffffff87) {
      local_24 = local_24 | 2;
    }
    local_4 = local_24;
  }
  blob_t::~blob_t((blob_t *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  return local_4;
}

Assistant:

int zmq::router_t::get_peer_state (const void *routing_id_,
                                   size_t routing_id_size_) const
{
    int res = 0;

    // TODO remove the const_cast, see comment in lookup_out_pipe
    const blob_t routing_id_blob (
      static_cast<unsigned char *> (const_cast<void *> (routing_id_)),
      routing_id_size_, reference_tag_t ());
    const out_pipe_t *out_pipe = lookup_out_pipe (routing_id_blob);
    if (!out_pipe) {
        errno = EHOSTUNREACH;
        return -1;
    }

    if (out_pipe->pipe->check_hwm ())
        res |= ZMQ_POLLOUT;

    /** \todo does it make any sense to check the inpipe as well? */

    return res;
}